

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_chi2_test<trng::discrete_dist>(discrete_dist *d)

{
  double *pdVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  double *pdVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  vector<double,_std::allocator<double>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  double local_d8;
  AssertionHandler local_c0;
  StringRef local_78;
  lcg64_shift local_68;
  StringRef local_50;
  SourceLineInfo local_40;
  
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  lVar12 = 8;
  uVar2 = 0;
  do {
    uVar11 = uVar2;
    iVar6 = (int)(d->P).N_;
    if ((long)(iVar6 + -1) < (long)uVar11) goto LAB_0025e317;
    local_c0.m_assertionInfo.macroName.m_start = (char *)0x0;
    if ((long)uVar11 < (long)iVar6) {
      pdVar1 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_c0.m_assertionInfo.macroName.m_start =
           (char *)(pdVar1[(d->P).offset_ + uVar11] / *pdVar1);
    }
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_c0);
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_c0.m_assertionInfo.macroName.m_start;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    bVar3 = true;
    if ((long)uVar11 < (long)(int)(d->P).N_) {
      pdVar7 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = pdVar7 + (d->P).offset_;
      dVar14 = 0.0;
      if (pdVar1 != pdVar1 + uVar11 + 1) {
        lVar5 = 0;
        do {
          dVar14 = dVar14 + *(double *)((long)pdVar1 + lVar5);
          lVar5 = lVar5 + 8;
        } while (lVar12 != lVar5);
      }
      bVar3 = 0.99 < dVar14 / *pdVar7;
    }
    lVar12 = lVar12 + 8;
    uVar2 = uVar11 + 1;
  } while (bVar3 == false);
  uVar11 = (ulong)((int)uVar11 + (uint)(bVar3 ^ 1));
LAB_0025e317:
  iVar6 = (int)(d->P).N_;
  if ((int)uVar11 < iVar6 + -1) {
    dVar14 = 1.0;
    if ((int)uVar11 < iVar6) {
      pdVar7 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = pdVar7 + (d->P).offset_;
      if (pdVar1 == pdVar1 + (uVar11 & 0xffffffff) + 1) {
        dVar14 = 0.0;
      }
      else {
        dVar14 = 0.0;
        lVar12 = 0;
        do {
          dVar14 = dVar14 + *(double *)((long)pdVar1 + lVar12);
          lVar12 = lVar12 + 8;
        } while ((uVar11 & 0xffffffff) * 8 + 8 != lVar12);
      }
      dVar14 = dVar14 / *pdVar7;
    }
    local_c0.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar14);
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_c0);
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_c0.m_assertionInfo.macroName.m_start;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar13 = (int)((ulong)((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  local_c0.m_assertionInfo.macroName.m_start =
       (char *)((ulong)local_c0.m_assertionInfo.macroName.m_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f0,(long)iVar13,(value_type_conflict *)&local_c0,(allocator_type *)&local_68);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_68,100,P);
  iVar13 = iVar13 + -1;
  iVar6 = 10000;
  do {
    iVar4 = trng::discrete_dist::operator()(d,&local_68);
    if (iVar13 < iVar4) {
      iVar4 = iVar13;
    }
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar4] = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar4] + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  do {
    if ((ulong)((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x11) break;
    piVar8 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar9 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar10 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (piVar8 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar9 = piVar8;
        if (*piVar10 <= *piVar8) {
          piVar9 = piVar10;
        }
        piVar8 = piVar8 + 1;
        piVar10 = piVar9;
      } while (piVar8 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    iVar6 = *piVar9;
    if (8 < iVar6) break;
    lVar12 = (long)piVar9 -
             (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pdVar1 = (double *)
             ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar12 * 2);
    pdVar7 = pdVar1 + 1;
    local_d8 = *pdVar1;
    iVar13 = *piVar9;
    if (pdVar7 != local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12 * 2),pdVar7,
              (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar7);
    }
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    piVar8 = (int *)((long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12 + 4);
    if (piVar8 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12),piVar8,
              (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar8);
    }
    local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    piVar8 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar9 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar10 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (piVar8 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar9 = piVar8;
        if (*piVar10 <= *piVar8) {
          piVar9 = piVar10;
        }
        piVar8 = piVar8 + 1;
        piVar10 = piVar9;
      } while (piVar8 != local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    *(double *)
     ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
     ((long)piVar9 -
     (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         local_d8 +
         *(double *)
          ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
          ((long)piVar9 -
          (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) * 2);
    *piVar9 = *piVar9 + iVar13;
  } while (iVar6 < 9);
  local_d8 = chi_percentil(&local_108,&local_f0);
  local_78.m_start = "REQUIRE";
  local_78.m_size = 7;
  local_40.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_40.line = 0x11c;
  Catch::StringRef::StringRef(&local_50,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler(&local_c0,&local_78,&local_40,local_50,Normal);
  local_78.m_start =
       (char *)(CONCAT71(local_78.m_start._1_7_,-(local_d8 < 0.99) & -(0.01 < local_d8)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&local_c0,(ExprLhs<bool> *)&local_78);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}